

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O2

void __thiscall cppjieba::HMMModel::HMMModel(HMMModel *this,string *modelPath)

{
  vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  *this_00;
  EmitProbMap *local_48;
  EmitProbMap *local_40;
  EmitProbMap *local_38;
  
  (this->emitProbB)._M_h._M_buckets = &(this->emitProbB)._M_h._M_single_bucket;
  (this->emitProbB)._M_h._M_bucket_count = 1;
  (this->emitProbB)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbB)._M_h._M_element_count = 0;
  (this->emitProbB)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitProbB)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbB)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->emitProbE)._M_h._M_buckets = &(this->emitProbE)._M_h._M_single_bucket;
  (this->emitProbE)._M_h._M_bucket_count = 1;
  (this->emitProbE)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbE)._M_h._M_element_count = 0;
  (this->emitProbE)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitProbE)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbE)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_40 = &this->emitProbM;
  (this->emitProbM)._M_h._M_buckets = &(this->emitProbM)._M_h._M_single_bucket;
  (this->emitProbM)._M_h._M_bucket_count = 1;
  (this->emitProbM)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbM)._M_h._M_element_count = 0;
  (this->emitProbM)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitProbM)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbM)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->emitProbS)._M_h._M_buckets = &(this->emitProbS)._M_h._M_single_bucket;
  (this->emitProbS)._M_h._M_bucket_count = 1;
  (this->emitProbS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitProbS)._M_h._M_element_count = 0;
  (this->emitProbS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this_00 = &this->emitProbVec;
  memset(this->startProb,0,0xa0);
  (this->emitProbS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitProbS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->emitProbVec).
  super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builtin_strncpy(this->statMap,"BEMS",4);
  local_48 = &this->emitProbB;
  local_38 = &this->emitProbB;
  std::
  vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
  ::
  emplace_back<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
            ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
              *)this_00,&local_48);
  local_48 = &this->emitProbE;
  std::
  vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
  ::
  emplace_back<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
            ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
              *)this_00,&local_48);
  local_48 = local_40;
  std::
  vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
  ::
  emplace_back<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
            ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
              *)this_00,&local_48);
  local_48 = &this->emitProbS;
  std::
  vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
  ::
  emplace_back<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>
            ((vector<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*,std::allocator<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>*>>
              *)this_00,&local_48);
  LoadModel(this,modelPath);
  return;
}

Assistant:

HMMModel(const string& modelPath) {
    memset(startProb, 0, sizeof(startProb));
    memset(transProb, 0, sizeof(transProb));
    statMap[0] = 'B';
    statMap[1] = 'E';
    statMap[2] = 'M';
    statMap[3] = 'S';
    emitProbVec.push_back(&emitProbB);
    emitProbVec.push_back(&emitProbE);
    emitProbVec.push_back(&emitProbM);
    emitProbVec.push_back(&emitProbS);
    LoadModel(modelPath);
  }